

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TFad<6,_double>,_3>::TPZManVector
          (TPZManVector<TFad<6,_double>,_3> *this,int64_t size,TFad<6,_double> *copy)

{
  long lVar1;
  int64_t *piVar2;
  TFad<6,_double> *pTVar3;
  int64_t iVar4;
  TFad<6,_double> *pTVar5;
  bool bVar6;
  
  TPZVec<TFad<6,_double>_>::TPZVec(&this->super_TPZVec<TFad<6,_double>_>,0);
  (this->super_TPZVec<TFad<6,_double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016ad190;
  lVar1 = 0x28;
  do {
    *(undefined ***)((long)this->fExtAlloc[0].dx_ + lVar1 + -0x38) = &PTR__TFad_0166af08;
    *(undefined1 (*) [16])((long)this->fExtAlloc[0].dx_ + lVar1 + -0x30) = (undefined1  [16])0x0;
    *(undefined8 *)((long)this->fExtAlloc[0].dx_ + lVar1) = 0;
    *(undefined1 (*) [16])((long)this->fExtAlloc[0].dx_ + lVar1 + -0x20) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)this->fExtAlloc[0].dx_ + lVar1 + -0x10) = (undefined1  [16])0x0;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xe8);
  if (size < 4) {
    pTVar3 = this->fExtAlloc;
    iVar4 = 0;
  }
  else {
    piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3a != 0) | size * 0x40 | 8);
    *piVar2 = size;
    pTVar3 = (TFad<6,_double> *)(piVar2 + 1);
    pTVar5 = pTVar3;
    do {
      (pTVar5->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
      pTVar5->val_ = 0.0;
      pTVar5->dx_[0] = 0.0;
      pTVar5->dx_[5] = 0.0;
      pTVar5->dx_[1] = 0.0;
      pTVar5->dx_[2] = 0.0;
      pTVar5->dx_[3] = 0.0;
      pTVar5->dx_[4] = 0.0;
      pTVar5 = pTVar5 + 1;
      iVar4 = size;
    } while (pTVar5 != (TFad<6,_double> *)(piVar2 + size * 8 + 1));
  }
  (this->super_TPZVec<TFad<6,_double>_>).fStore = pTVar3;
  (this->super_TPZVec<TFad<6,_double>_>).fNElements = size;
  (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = iVar4;
  lVar1 = 0;
  if (size < 1) {
    size = lVar1;
  }
  while (bVar6 = size != 0, size = size + -1, bVar6) {
    TFad<6,_double>::operator=
              ((TFad<6,_double> *)
               ((long)((this->super_TPZVec<TFad<6,_double>_>).fStore)->dx_ + lVar1 + -0x10),copy);
    lVar1 = lVar1 + 0x40;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}